

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui-ws.cpp
# Opt level: O1

int __thiscall ImGuiWS::init(ImGuiWS *this,EVP_PKEY_CTX *ctx)

{
  _Head_base<0UL,_ImGuiWS::Impl_*,_false> _Var1;
  Parameters PVar2;
  undefined1 *extraout_RAX;
  undefined1 *puVar3;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *in_RCX;
  string *in_RDX;
  Parameters parameters;
  thread tVar4;
  undefined8 uVar5;
  code *pcVar6;
  code *pcVar7;
  int32_t iVar8;
  int32_t iVar9;
  size_type sVar10;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 uVar11;
  undefined4 in_stack_fffffffffffffebc;
  undefined4 uVar12;
  undefined8 uVar13;
  size_type sVar14;
  undefined2 uVar15;
  undefined6 in_stack_fffffffffffffed2;
  undefined8 in_stack_fffffffffffffed8;
  pointer pbVar16;
  pointer pbVar17;
  pointer pbVar18;
  _Alloc_hider _Var19;
  char *pcVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined8 in_stack_ffffffffffffff10;
  _Alloc_hider local_e8;
  char *local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  int32_t local_c4;
  Parameters local_c0;
  
  _Var1._M_head_impl =
       (this->m_impl)._M_t.super___uniq_ptr_impl<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>
       ._M_t.super__Tuple_impl<0UL,_ImGuiWS::Impl_*,_std::default_delete<ImGuiWS::Impl>_>.
       super__Head_base<0UL,_ImGuiWS::Impl_*,_false>._M_head_impl;
  _Var19._M_p = &stack0xfffffffffffffeb8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffffea8,"my_id[%d]","")
  ;
  pcVar6 = std::
           _Function_handler<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/src/imgui-ws.cpp:86:36)>
           ::_M_manager;
  Incppect<false>::var((string *)&(_Var1._M_head_impl)->incpp,(function *)&stack0xfffffffffffffea8);
  if (pcVar6 != (code *)0x0) {
    (*pcVar6)(&stack0xfffffffffffffe88,&stack0xfffffffffffffe88,3);
  }
  if (_Var19._M_p != &stack0xfffffffffffffeb8) {
    operator_delete(_Var19._M_p,CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8) + 1);
  }
  _Var1._M_head_impl =
       (this->m_impl)._M_t.super___uniq_ptr_impl<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>
       ._M_t.super__Tuple_impl<0UL,_ImGuiWS::Impl_*,_std::default_delete<ImGuiWS::Impl>_>.
       super__Head_base<0UL,_ImGuiWS::Impl_*,_false>._M_head_impl;
  _Var19._M_p = &stack0xfffffffffffffeb8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffea8,"imgui.n_textures","");
  pcVar6 = std::
           _Function_handler<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/src/imgui-ws.cpp:93:43)>
           ::_M_manager;
  Incppect<false>::var((string *)&(_Var1._M_head_impl)->incpp,(function *)&stack0xfffffffffffffea8);
  if (pcVar6 != (code *)0x0) {
    (*pcVar6)(&stack0xfffffffffffffe88,&stack0xfffffffffffffe88,3);
  }
  if (_Var19._M_p != &stack0xfffffffffffffeb8) {
    operator_delete(_Var19._M_p,CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8) + 1);
  }
  _Var1._M_head_impl =
       (this->m_impl)._M_t.super___uniq_ptr_impl<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>
       ._M_t.super__Tuple_impl<0UL,_ImGuiWS::Impl_*,_std::default_delete<ImGuiWS::Impl>_>.
       super__Head_base<0UL,_ImGuiWS::Impl_*,_false>._M_head_impl;
  _Var19._M_p = &stack0xfffffffffffffeb8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffea8,"imgui.texture_id[%d]","");
  pcVar6 = std::
           _Function_handler<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/src/imgui-ws.cpp:100:47)>
           ::_M_manager;
  Incppect<false>::var((string *)&(_Var1._M_head_impl)->incpp,(function *)&stack0xfffffffffffffea8);
  if (pcVar6 != (code *)0x0) {
    (*pcVar6)(&stack0xfffffffffffffe88,&stack0xfffffffffffffe88,3);
  }
  if (_Var19._M_p != &stack0xfffffffffffffeb8) {
    operator_delete(_Var19._M_p,CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8) + 1);
  }
  _Var1._M_head_impl =
       (this->m_impl)._M_t.super___uniq_ptr_impl<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>
       ._M_t.super__Tuple_impl<0UL,_ImGuiWS::Impl_*,_std::default_delete<ImGuiWS::Impl>_>.
       super__Head_base<0UL,_ImGuiWS::Impl_*,_false>._M_head_impl;
  _Var19._M_p = &stack0xfffffffffffffeb8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffea8,"imgui.texture_revision[%d]","");
  pcVar6 = std::
           _Function_handler<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/src/imgui-ws.cpp:111:53)>
           ::_M_manager;
  Incppect<false>::var((string *)&(_Var1._M_head_impl)->incpp,(function *)&stack0xfffffffffffffea8);
  if (pcVar6 != (code *)0x0) {
    (*pcVar6)(&stack0xfffffffffffffe88,&stack0xfffffffffffffe88,3);
  }
  if (_Var19._M_p != &stack0xfffffffffffffeb8) {
    operator_delete(_Var19._M_p,CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8) + 1);
  }
  _Var1._M_head_impl =
       (this->m_impl)._M_t.super___uniq_ptr_impl<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>
       ._M_t.super__Tuple_impl<0UL,_ImGuiWS::Impl_*,_std::default_delete<ImGuiWS::Impl>_>.
       super__Head_base<0UL,_ImGuiWS::Impl_*,_false>._M_head_impl;
  _Var19._M_p = &stack0xfffffffffffffeb8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffea8,"imgui.texture_data[%d]","");
  pcVar6 = std::
           _Function_handler<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/src/imgui-ws.cpp:122:49)>
           ::_M_manager;
  Incppect<false>::var((string *)&(_Var1._M_head_impl)->incpp,(function *)&stack0xfffffffffffffea8);
  if (pcVar6 != (code *)0x0) {
    (*pcVar6)(&stack0xfffffffffffffe88,&stack0xfffffffffffffe88,3);
  }
  if (_Var19._M_p != &stack0xfffffffffffffeb8) {
    operator_delete(_Var19._M_p,CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8) + 1);
  }
  _Var1._M_head_impl =
       (this->m_impl)._M_t.super___uniq_ptr_impl<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>
       ._M_t.super__Tuple_impl<0UL,_ImGuiWS::Impl_*,_std::default_delete<ImGuiWS::Impl>_>.
       super__Head_base<0UL,_ImGuiWS::Impl_*,_false>._M_head_impl;
  _Var19._M_p = &stack0xfffffffffffffeb8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffea8,"imgui.n_draw_lists","");
  pcVar6 = std::
           _Function_handler<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/src/imgui-ws.cpp:138:45)>
           ::_M_manager;
  Incppect<false>::var((string *)&(_Var1._M_head_impl)->incpp,(function *)&stack0xfffffffffffffea8);
  if (pcVar6 != (code *)0x0) {
    (*pcVar6)(&stack0xfffffffffffffe88,&stack0xfffffffffffffe88,3);
  }
  if (_Var19._M_p != &stack0xfffffffffffffeb8) {
    operator_delete(_Var19._M_p,CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8) + 1);
  }
  _Var1._M_head_impl =
       (this->m_impl)._M_t.super___uniq_ptr_impl<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>
       ._M_t.super__Tuple_impl<0UL,_ImGuiWS::Impl_*,_std::default_delete<ImGuiWS::Impl>_>.
       super__Head_base<0UL,_ImGuiWS::Impl_*,_false>._M_head_impl;
  _Var19._M_p = &stack0xfffffffffffffeb8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffea8,"imgui.draw_list[%d]","");
  uVar5 = 0;
  pcVar7 = std::
           _Function_handler<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/src/imgui-ws.cpp:144:46)>
           ::_M_invoke;
  pcVar6 = std::
           _Function_handler<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/src/imgui-ws.cpp:144:46)>
           ::_M_manager;
  Incppect<false>::var((string *)&(_Var1._M_head_impl)->incpp,(function *)&stack0xfffffffffffffea8);
  if (pcVar6 != (code *)0x0) {
    (*pcVar6)(&stack0xfffffffffffffe88,&stack0xfffffffffffffe88,3);
  }
  if (_Var19._M_p != &stack0xfffffffffffffeb8) {
    operator_delete(_Var19._M_p,CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8) + 1);
  }
  uVar11 = 0x1772ca;
  uVar12 = 0;
  Incppect<false>::handler
            ((function *)
             &((this->m_impl)._M_t.
               super___uniq_ptr_impl<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>._M_t.
               super__Tuple_impl<0UL,_ImGuiWS::Impl_*,_std::default_delete<ImGuiWS::Impl>_>.
               super__Head_base<0UL,_ImGuiWS::Impl_*,_false>._M_head_impl)->incpp);
  if ((code *)CONCAT44(uVar12,uVar11) != (code *)0x0) {
    (*(code *)CONCAT44(uVar12,uVar11))(&stack0xfffffffffffffea8,&stack0xfffffffffffffea8,3);
  }
  _Var19._M_p = &stack0xfffffffffffffeb8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffea8,"imgui-ws.js","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            (in_RCX,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    &stack0xfffffffffffffea8);
  local_c4 = (int32_t)ctx;
  if (_Var19._M_p != &stack0xfffffffffffffeb8) {
    operator_delete(_Var19._M_p,CONCAT44(uVar12,uVar11) + 1);
  }
  _Var1._M_head_impl =
       (this->m_impl)._M_t.super___uniq_ptr_impl<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>
       ._M_t.super__Tuple_impl<0UL,_ImGuiWS::Impl_*,_std::default_delete<ImGuiWS::Impl>_>.
       super__Head_base<0UL,_ImGuiWS::Impl_*,_false>._M_head_impl;
  _Var19._M_p = &stack0xfffffffffffffeb8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffea8,"/imgui-ws.js","");
  tVar4._M_id._M_thread = (id)(id)&stack0xfffffffffffffe98;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffe88,
             "\n\nvar imgui_ws = {\n    canvas: null,\n    gl: null,\n\n    shader_program: null,\n    vertex_buffer: null,\n    index_buffer: null,\n\n    attribute_location_tex: null,\n    attribute_location_proj_mtx: null,\n    attribute_location_position: null,\n    attribute_location_uv: null,\n    attribute_location_color: null,\n\n    device_pixel_ratio: window.device_pixel_ratio || 1,\n\n    tex_map_id: {},\n    tex_map_rev: {},\n    tex_map_abuf: {},\n\n    n_draw_lists: null,\n    draw_lists_abuf: {},\n\n    io: {\n        mouse_x: 0.0,\n        mouse_y: 0.0,\n\n        want_capture_mouse: true,\n        want_capture_keyboard: true,\n    },\n\n    init: function(canvas_name) {\n        this.canvas = document.getElementById(canvas_name);\n\n        var onkeyup = this.canvas_on_keyup.bind(this);\n        var onkeydown = this.canvas_on_keydown.bind(this);\n        var onkeypress = this.canvas_on_keypress.bind(this);\n        var onpointermove = this.canvas_on_pointermove.bind(this);\n        var onpointerdown = this.canvas_on_pointerdown.bind(this);\n        var onpointerup = this.canvas_on_pointerup.bind(this);\n        var onwheel = this.canvas_on_wheel.bind(this);\n        var ontouch = this.canvas_on_touch.bind(this);\n\n        //this.canvas.style.touchAction = \'none\'; // Disable browser handling of all panning and zooming gestures.\n        //this.canvas.addEventListener(\'blur\', this.canvas_on_blur);\n\n        this.canvas.addEventListener(\'keyup\', onkeyup, true);\n        this.canvas.addEventListener(\'keydown\', onkeydown, true);\n        this.canvas.addEventListener(\'keypress\', onkeypress, true);\n\n        this.canvas.addEventListener(\'pointermove\', onpointermove);\n        this.canvas.addEventListener(\'mousemove\', onpointermove);\n\n        this.canvas.addEventListener(\'pointerdown\', onpointerdown);\n        this.canvas.addEventListener(\'mousedown\', onpointerdown);\n\n        this.canvas.addEventListener(\'pointerup\', onpointerup);\n        this.canvas.addEventListener(\'mouseup\', onpointerup);\n\n        this.canvas.addEventListener(\'contextmenu\', function(event) { event...." /* TRUNCATED STRING LITERAL */
             ,"");
  Incppect<false>::setResource
            ((string *)&(_Var1._M_head_impl)->incpp,(string *)&stack0xfffffffffffffea8);
  if (tVar4._M_id._M_thread != (id)&stack0xfffffffffffffe98) {
    operator_delete((void *)tVar4._M_id._M_thread,(ulong)(pcVar6 + 1));
  }
  if (_Var19._M_p != &stack0xfffffffffffffeb8) {
    operator_delete(_Var19._M_p,CONCAT44(uVar12,uVar11) + 1);
  }
  iVar9 = 0x100000;
  uVar11 = 0x78;
  uVar13 = &stack0xfffffffffffffed0;
  uVar15 = 0x2e;
  sVar14 = 1;
  pbVar16 = (pointer)0x0;
  pbVar17 = (pointer)0x0;
  pbVar18 = (pointer)0x0;
  uVar21 = 0x2e79656b;
  pcVar20 = (char *)0x7;
  uVar22 = 0x6d6570;
  local_d8._M_allocated_capacity = 0x6d65702e74726563;
  local_e0 = (char *)0x8;
  local_d8._M_local_buf[8] = '\0';
  sVar10 = 0xffffffffffffffff;
  iVar8 = local_c4;
  _Var19._M_p = &stack0xffffffffffffff08;
  local_e8._M_p = (pointer)&local_d8;
  std::__cxx11::string::operator=((string *)&stack0xfffffffffffffec0,in_RDX);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&stack0xfffffffffffffee0);
  std::__cxx11::string::_M_replace((ulong)&stack0xfffffffffffffef8,0,pcVar20,0x195945);
  std::__cxx11::string::_M_replace((ulong)&local_e8,0,local_e0,0x19594d);
  Incppect<false>::Parameters::Parameters(&local_c0,(Parameters *)&stack0xfffffffffffffea8);
  PVar2.tLastRequestTimeout_ms = uVar5;
  PVar2.portListen = SUB84(tVar4._M_id._M_thread,0);
  PVar2.maxPayloadLength_bytes = (int)((ulong)tVar4._M_id._M_thread >> 0x20);
  PVar2._16_8_ = pcVar6;
  PVar2.httpRoot._M_dataplus._M_p = (pointer)pcVar7;
  PVar2.httpRoot._M_string_length._0_4_ = iVar8;
  PVar2.httpRoot._M_string_length._4_4_ = iVar9;
  PVar2.httpRoot.field_2._M_allocated_capacity = sVar10;
  PVar2.httpRoot.field_2._8_4_ = uVar11;
  PVar2.httpRoot.field_2._12_4_ = uVar12;
  PVar2.resources.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)uVar13;
  PVar2.resources.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)sVar14;
  PVar2.resources.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = uVar15;
  PVar2.resources.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._2_6_ = in_stack_fffffffffffffed2;
  PVar2.sslKey._M_dataplus._M_p = (pointer)in_stack_fffffffffffffed8;
  PVar2.sslKey._M_string_length = (size_type)pbVar16;
  PVar2.sslKey.field_2._M_allocated_capacity = (size_type)pbVar17;
  PVar2.sslKey.field_2._8_8_ = pbVar18;
  PVar2.sslCert._M_dataplus._M_p = _Var19._M_p;
  PVar2.sslCert._M_string_length = (size_type)pcVar20;
  PVar2.sslCert.field_2._M_allocated_capacity._0_4_ = uVar21;
  PVar2.sslCert.field_2._M_allocated_capacity._4_4_ = uVar22;
  PVar2.sslCert.field_2._8_8_ = in_stack_ffffffffffffff10;
  Incppect<false>::runAsync(PVar2);
  _Var1._M_head_impl =
       (this->m_impl)._M_t.super___uniq_ptr_impl<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>
       ._M_t.super__Tuple_impl<0UL,_ImGuiWS::Impl_*,_std::default_delete<ImGuiWS::Impl>_>.
       super__Head_base<0UL,_ImGuiWS::Impl_*,_false>._M_head_impl;
  if ((native_handle_type)((_Var1._M_head_impl)->worker)._M_id == 0) {
    ((_Var1._M_head_impl)->worker)._M_id = tVar4._M_id._M_thread;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0.sslCert._M_dataplus._M_p != &local_c0.sslCert.field_2) {
      operator_delete(local_c0.sslCert._M_dataplus._M_p,
                      local_c0.sslCert.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0.sslKey._M_dataplus._M_p != &local_c0.sslKey.field_2) {
      operator_delete(local_c0.sslKey._M_dataplus._M_p,
                      local_c0.sslKey.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_c0.resources);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0.httpRoot._M_dataplus._M_p != &local_c0.httpRoot.field_2) {
      operator_delete(local_c0.httpRoot._M_dataplus._M_p,
                      local_c0.httpRoot.field_2._M_allocated_capacity + 1);
    }
    tVar4._M_id._M_thread =
         (((this->m_impl)._M_t.
           super___uniq_ptr_impl<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>._M_t.
           super__Tuple_impl<0UL,_ImGuiWS::Impl_*,_std::default_delete<ImGuiWS::Impl>_>.
           super__Head_base<0UL,_ImGuiWS::Impl_*,_false>._M_head_impl)->worker)._M_id;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_p != &local_d8) {
      operator_delete(local_e8._M_p,local_d8._M_allocated_capacity + 1);
    }
    if (_Var19._M_p != &stack0xffffffffffffff08) {
      operator_delete(_Var19._M_p,CONCAT44(uVar22,uVar21) + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&stack0xfffffffffffffee0);
    puVar3 = &stack0xfffffffffffffed0;
    if ((undefined1 *)uVar13 != puVar3) {
      operator_delete((void *)uVar13,CONCAT62(in_stack_fffffffffffffed2,uVar15) + 1);
      puVar3 = extraout_RAX;
    }
    return (int)CONCAT71((int7)((ulong)puVar3 >> 8),tVar4._M_id._M_thread != 0);
  }
  std::terminate();
}

Assistant:

bool ImGuiWS::init(int32_t port, std::string pathHttp, std::vector<std::string> resources) {
    m_impl->incpp.var("my_id[%d]", [](const auto & idxs) {
        static int32_t id;
        id = idxs[0];
        return incppect::view(id);
    });

    // number of textures available
    m_impl->incpp.var("imgui.n_textures", [this](const auto & ) {
        std::shared_lock lock(m_impl->mutex);

        return incppect::view(m_impl->dataRead.textures.size());
    });

    // texture ids
    m_impl->incpp.var("imgui.texture_id[%d]", [this](const auto & idxs) {
        std::shared_lock lock(m_impl->mutex);

        if (m_impl->dataRead.textureIdMap.find(idxs[0]) == m_impl->dataRead.textureIdMap.end()) {
            return std::string_view { };
        }

        return incppect::view(m_impl->dataRead.textureIdMap[idxs[0]]);
    });

    // texture revision
    m_impl->incpp.var("imgui.texture_revision[%d]", [this](const auto & idxs) {
        std::shared_lock lock(m_impl->mutex);

        if (m_impl->dataRead.textures.find(idxs[0]) == m_impl->dataRead.textures.end()) {
            return std::string_view { };
        }

        return incppect::view(m_impl->dataRead.textures[idxs[0]].revision);
    });

    // get texture by id
    m_impl->incpp.var("imgui.texture_data[%d]", [this](const auto & idxs) {
        static std::vector<char> data;
        {
            std::shared_lock lock(m_impl->mutex);
            if (m_impl->dataRead.textures.find(idxs[0]) == m_impl->dataRead.textures.end()) {
                return std::string_view { 0, 0 };
            }
            data.clear();
            std::copy(m_impl->dataRead.textures[idxs[0]].data.data(), m_impl->dataRead.textures[idxs[0]].data.data() + m_impl->dataRead.textures[idxs[0]].data.size(),
                      std::back_inserter(data));
        }

        return std::string_view { data.data(), data.size() };
    });

    // get imgui's draw data
    m_impl->incpp.var("imgui.n_draw_lists", [this](const auto & ) {
        std::shared_lock lock(m_impl->mutex);

        return incppect::view(m_impl->dataRead.drawLists.size());
    });

    m_impl->incpp.var("imgui.draw_list[%d]", [this](const auto & idxs) {
        static std::vector<char> data;
        {
            std::shared_lock lock(m_impl->mutex);

            if (idxs[0] >= (int) m_impl->dataRead.drawLists.size()) {
                return std::string_view { nullptr, 0 };
            }

            data.clear();
            std::copy(m_impl->dataRead.drawLists[idxs[0]].data(),
                      m_impl->dataRead.drawLists[idxs[0]].data() + m_impl->dataRead.drawLists[idxs[0]].size(),
                      std::back_inserter(data));
        }

        return std::string_view { data.data(), data.size() };
    });

    m_impl->incpp.handler([&](int clientId, incppect::EventType etype, std::string_view data) {
        Event event;

        event.clientId = clientId;

        switch (etype) {
            case incppect::Connect:
                {
                    ++m_impl->nConnected;
                    event.type = Event::Connected;
                    std::stringstream ss;
                    { int a = data[0]; if (a < 0) a += 256; ss << a << "."; }
                    { int a = data[1]; if (a < 0) a += 256; ss << a << "."; }
                    { int a = data[2]; if (a < 0) a += 256; ss << a << "."; }
                    { int a = data[3]; if (a < 0) a += 256; ss << a; }
                    event.ip = ss.str();
                    if (m_impl->handlerConnect) {
                        m_impl->handlerConnect();
                    }
                }
                break;
            case incppect::Disconnect:
                {
                    --m_impl->nConnected;
                    event.type = Event::Disconnected;
                    if (m_impl->handlerDisconnect) {
                        m_impl->handlerDisconnect();
                    }
                }
                break;
            case incppect::Custom:
                {
                    std::stringstream ss;
                    ss << data;

                    int type = -1;
                    ss >> type;

                    //printf("Received event %d '%s'\n", type, ss.str().c_str());
                    switch (type) {
                        case 0:
                            {
                                // mouse move
                                event.type = Event::MouseMove;
                                ss >> event.mouse_x >> event.mouse_y;
                                //printf("    mouse %g %g\n", event.mouse_x, event.mouse_y);
                            }
                            break;
                        case 1:
                            {
                                // mouse down
                                event.type = Event::MouseDown;
                                ss >> event.mouse_but >> event.mouse_x >> event.mouse_y;
                                //printf("    mouse %d down\n", event.mouse_but);
                            }
                            break;
                        case 2:
                            {
                                // mouse up
                                event.type = Event::MouseUp;
                                ss >> event.mouse_but >> event.mouse_x >> event.mouse_y;
                                //printf("    mouse %d up\n", event.mouse_but);
                            }
                            break;
                        case 3:
                            {
                                // mouse wheel
                                event.type = Event::MouseWheel;
                                ss >> event.wheel_x >> event.wheel_y;
                            }
                            break;
                        case 4:
                            {
                                // key press
                                event.type = Event::KeyPress;
                                ss >> event.key;
                            }
                            break;
                        case 5:
                            {
                                // key down
                                event.type = Event::KeyDown;
                                ss >> event.key;
                            }
                            break;
                        case 6:
                            {
                                // key up
                                event.type = Event::KeyUp;
                                ss >> event.key;
                            }
                            break;
                        case 7:
                            {
                                // resize
                                event.type = Event::Resize;
                                ss >> event.client_width >> event.client_height;
                            }
                            break;
                        case 8:
                            {
                                // take control
                                event.type = Event::TakeControl;
                            }
                            break;
                        default:
                            {
                                printf("Unknown input received from client: id = %d, type = %d\n", clientId, type);
                                return;
                            }
                            break;
                    };
                }
                break;
        };

        m_impl->events.push(std::move(event));
    });

    resources.push_back("imgui-ws.js");
    m_impl->incpp.setResource("/imgui-ws.js", kImGuiWS_js);

    // start the http/websocket server
    incppect::Parameters parameters;
    parameters.portListen = port;
    parameters.maxPayloadLength_bytes = 1024*1024;
    parameters.tLastRequestTimeout_ms = -1;
    parameters.httpRoot = std::move(pathHttp);
    parameters.resources = std::move(resources);
    parameters.sslKey = "key.pem";
    parameters.sslCert = "cert.pem";
    m_impl->worker = m_impl->incpp.runAsync(parameters);

    return m_impl->worker.joinable();
}